

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DoEdge2(Clipper *this,TEdge *edge1,TEdge *edge2,IntPoint *pt)

{
  IntPoint *pt_local;
  TEdge *edge2_local;
  TEdge *edge1_local;
  Clipper *this_local;
  
  AddOutPt(this,edge2,pt);
  SwapSides(edge1,edge2);
  SwapPolyIndexes(edge1,edge2);
  return;
}

Assistant:

void Clipper::DoEdge2(TEdge *edge1, TEdge *edge2, const IntPoint &pt)
{
  AddOutPt(edge2, pt);
  SwapSides(*edge1, *edge2);
  SwapPolyIndexes(*edge1, *edge2);
}